

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O3

void __thiscall
google::protobuf::MapReflectionTester::MapReflectionTester
          (MapReflectionTester *this,Descriptor *base_descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DescriptorPool *this_00;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Descriptor *this_01;
  ushort *puVar4;
  EnumValueDescriptor *pEVar5;
  FieldDescriptor *pFVar6;
  AlphaNum *b;
  AssertHelperData *pAVar7;
  pointer *__ptr;
  char *pcVar8;
  char *in_R9;
  _Alloc_hider _Var9;
  internal iVar10;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  string_view name_25;
  string_view name_26;
  string_view name_27;
  string_view name_28;
  string_view name_29;
  string_view name_30;
  string_view name_31;
  string_view name_32;
  string_view name_33;
  string_view name_34;
  string_view name_35;
  string_view name_36;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  string_view v;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  all_map_descriptors;
  FieldDescriptor *fdesc;
  size_type __dnew;
  string local_1b8;
  AssertHelper local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  undefined1 local_188 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  undefined1 local_178 [32];
  undefined1 local_158 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  FieldDescriptor *local_138;
  FieldDescriptor *pFStack_130;
  FieldDescriptor *local_128;
  FieldDescriptor *pFStack_120;
  FieldDescriptor *local_118;
  FieldDescriptor *pFStack_110;
  FieldDescriptor *local_108;
  FieldDescriptor *pFStack_100;
  FieldDescriptor *local_f8;
  FieldDescriptor *pFStack_f0;
  FieldDescriptor *local_e8;
  FieldDescriptor *pFStack_e0;
  FieldDescriptor *local_d8;
  FieldDescriptor *pFStack_d0;
  FieldDescriptor *local_c8;
  FieldDescriptor *pFStack_c0;
  FieldDescriptor *local_b8;
  FieldDescriptor *pFStack_b0;
  FieldDescriptor *local_a8;
  FieldDescriptor *pFStack_a0;
  FieldDescriptor *local_98;
  FieldDescriptor *pFStack_90;
  FieldDescriptor *local_88;
  FieldDescriptor *pFStack_80;
  FieldDescriptor *local_78;
  FieldDescriptor *pFStack_70;
  FieldDescriptor *local_68;
  FieldDescriptor *pFStack_60;
  FieldDescriptor *local_58;
  FieldDescriptor *pFStack_50;
  AssertHelper local_40;
  unsigned_long local_38;
  
  this->base_descriptor_ = base_descriptor;
  b = (AlphaNum *)base_descriptor->file_->package_;
  this_00 = base_descriptor->file_->pool_;
  _Var2._M_head_impl = (LogMessageData *)(b->piece_)._M_len;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(b->piece_)._M_str;
  local_188 = (undefined1  [8])&DAT_0000000d;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241070;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name._M_str = local_1b8._M_dataplus._M_p;
  name._M_len = local_1b8._M_string_length;
  pEVar5 = DescriptorPool::FindEnumValueByName(this_00,name);
  this->map_enum_foo_ = pEVar5;
  paVar1 = &local_1b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_0000000d;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x124107e;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_00._M_str = local_1b8._M_dataplus._M_p;
  name_00._M_len = local_1b8._M_string_length;
  pEVar5 = DescriptorPool::FindEnumValueByName(this_00,name_00);
  this->map_enum_bar_ = pEVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_0000000d;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x124108c;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_01._M_str = local_1b8._M_dataplus._M_p;
  name_01._M_len = local_1b8._M_string_length;
  pEVar5 = DescriptorPool::FindEnumValueByName(this_00,name_01);
  this->map_enum_baz_ = pEVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000011;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e418d;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_02._M_str = local_1b8._M_dataplus._M_p;
  name_02._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_02);
  this->foreign_c_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_0000001f;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x124109a;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_03._M_str = local_1b8._M_dataplus._M_p;
  name_03._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_03);
  this->map_int32_int32_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000021;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12410ba;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_04._M_str = local_1b8._M_dataplus._M_p;
  name_04._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_04);
  this->map_int32_int32_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_0000001f;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12410dc;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_05._M_str = local_1b8._M_dataplus._M_p;
  name_05._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_05);
  this->map_int64_int64_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000021;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12410fc;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_06._M_str = local_1b8._M_dataplus._M_p;
  name_06._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_06);
  this->map_int64_int64_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000021;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x124111e;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_07._M_str = local_1b8._M_dataplus._M_p;
  name_07._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_07);
  this->map_uint32_uint32_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x23;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241140;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_08._M_str = local_1b8._M_dataplus._M_p;
  name_08._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_08);
  this->map_uint32_uint32_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000021;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241164;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_09._M_str = local_1b8._M_dataplus._M_p;
  name_09._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_09);
  this->map_uint64_uint64_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x23;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241186;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_10._M_str = local_1b8._M_dataplus._M_p;
  name_10._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_10);
  this->map_uint64_uint64_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000021;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12411aa;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_11._M_str = local_1b8._M_dataplus._M_p;
  name_11._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_11);
  this->map_sint32_sint32_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x23;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12411cc;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_12._M_str = local_1b8._M_dataplus._M_p;
  name_12._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_12);
  this->map_sint32_sint32_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000021;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12411f0;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_13._M_str = local_1b8._M_dataplus._M_p;
  name_13._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_13);
  this->map_sint64_sint64_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x23;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241212;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_14._M_str = local_1b8._M_dataplus._M_p;
  name_14._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_14);
  this->map_sint64_sint64_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x23;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241236;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_15._M_str = local_1b8._M_dataplus._M_p;
  name_15._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_15);
  this->map_fixed32_fixed32_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x25;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x124125a;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_16._M_str = local_1b8._M_dataplus._M_p;
  name_16._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_16);
  this->map_fixed32_fixed32_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x23;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241280;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_17._M_str = local_1b8._M_dataplus._M_p;
  name_17._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_17);
  this->map_fixed64_fixed64_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x25;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12412a4;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_18._M_str = local_1b8._M_dataplus._M_p;
  name_18._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_18);
  this->map_fixed64_fixed64_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x25;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12412ca;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_19._M_str = local_1b8._M_dataplus._M_p;
  name_19._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_19);
  this->map_sfixed32_sfixed32_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x27;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12412f0;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_20._M_str = local_1b8._M_dataplus._M_p;
  name_20._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_20);
  this->map_sfixed32_sfixed32_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x25;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241318;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_21._M_str = local_1b8._M_dataplus._M_p;
  name_21._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_21);
  this->map_sfixed64_sfixed64_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x27;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x124133e;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_22._M_str = local_1b8._M_dataplus._M_p;
  name_22._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_22);
  this->map_sfixed64_sfixed64_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_0000001f;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241366;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_23._M_str = local_1b8._M_dataplus._M_p;
  name_23._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_23);
  this->map_int32_float_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000021;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241386;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_24._M_str = local_1b8._M_dataplus._M_p;
  name_24._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_24);
  this->map_int32_float_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000020;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12413a8;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_25._M_str = local_1b8._M_dataplus._M_p;
  name_25._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_25);
  this->map_int32_double_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x22;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12413c9;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_26._M_str = local_1b8._M_dataplus._M_p;
  name_26._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_26);
  this->map_int32_double_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_0000001d;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12413ec;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_27._M_str = local_1b8._M_dataplus._M_p;
  name_27._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_27);
  this->map_bool_bool_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_0000001f;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x124140a;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_28._M_str = local_1b8._M_dataplus._M_p;
  name_28._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_28);
  this->map_bool_bool_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000021;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x124142a;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_29._M_str = local_1b8._M_dataplus._M_p;
  name_29._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_29);
  this->map_string_string_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])0x23;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x124144c;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_30._M_str = local_1b8._M_dataplus._M_p;
  name_30._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_30);
  this->map_string_string_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_0000001f;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241470;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_31._M_str = local_1b8._M_dataplus._M_p;
  name_31._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_31);
  this->map_int32_bytes_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000021;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1241490;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_32._M_str = local_1b8._M_dataplus._M_p;
  name_32._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_32);
  this->map_int32_bytes_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_0000001e;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12414b2;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_33._M_str = local_1b8._M_dataplus._M_p;
  name_33._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_33);
  this->map_int32_enum_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000020;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12414d1;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_34._M_str = local_1b8._M_dataplus._M_p;
  name_34._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_34);
  this->map_int32_enum_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_00000028;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12414f2;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_35._M_str = local_1b8._M_dataplus._M_p;
  name_35._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_35);
  this->map_int32_foreign_message_key_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_188 = (undefined1  [8])&DAT_0000002a;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x124151b;
  local_158 = (undefined1  [8])paVar3;
  _Stack_150._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)local_158,(AlphaNum *)local_188,b);
  name_36._M_str = local_1b8._M_dataplus._M_p;
  name_36._M_len = local_1b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_36);
  this->map_int32_foreign_message_val_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  iVar10 = (internal)(this->map_enum_foo_ != (EnumValueDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)iVar10) {
    local_188[0] = iVar10;
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_enum_foo_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6a,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_enum_bar_ != (EnumValueDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_enum_bar_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6b,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_enum_baz_ != (EnumValueDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_enum_baz_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6c,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_int32_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_int32_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6d,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_int32_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_int32_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6e,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int64_int64_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int64_int64_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6f,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int64_int64_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int64_int64_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x70,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_uint32_uint32_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_uint32_uint32_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x71,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_uint32_uint32_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_uint32_uint32_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x72,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_uint64_uint64_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_uint64_uint64_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x73,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_uint64_uint64_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_uint64_uint64_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x74,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_sint32_sint32_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_sint32_sint32_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x75,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_sint32_sint32_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_sint32_sint32_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x76,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_sint64_sint64_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_sint64_sint64_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x77,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_sint64_sint64_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_sint64_sint64_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x78,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_fixed32_fixed32_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_fixed32_fixed32_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x79,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_fixed32_fixed32_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_fixed32_fixed32_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7a,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_fixed64_fixed64_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_fixed64_fixed64_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7b,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_fixed64_fixed64_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_fixed64_fixed64_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7c,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_sfixed32_sfixed32_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_sfixed32_sfixed32_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7d,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_sfixed32_sfixed32_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_sfixed32_sfixed32_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7e,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_sfixed64_sfixed64_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_sfixed64_sfixed64_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7f,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_sfixed64_sfixed64_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_sfixed64_sfixed64_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x80,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_float_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_float_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x81,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_float_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_float_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x82,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_double_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_double_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x83,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_double_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_double_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x84,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_bool_bool_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_bool_bool_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x85,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_bool_bool_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_bool_bool_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x86,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_string_string_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_string_string_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x87,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_string_string_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_string_string_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x88,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_bytes_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_bytes_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x89,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_bytes_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_bytes_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8a,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_enum_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_enum_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8b,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_enum_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_enum_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8c,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_foreign_message_key_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_foreign_message_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8d,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_188[0] = (internal)(this->map_int32_foreign_message_val_ != (FieldDescriptor *)0x0);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_188,
               (AssertionResult *)"map_int32_foreign_message_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8e,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
    if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_180,local_180);
    }
  }
  local_158 = (undefined1  [8])this->map_int32_int32_key_;
  _Stack_150._M_head_impl = (LogMessageData *)this->map_int32_int32_val_;
  local_148._M_allocated_capacity = (size_type)this->map_int64_int64_key_;
  local_148._8_8_ = this->map_int64_int64_val_;
  local_138 = this->map_uint32_uint32_key_;
  pFStack_130 = this->map_uint32_uint32_val_;
  local_128 = this->map_uint64_uint64_key_;
  pFStack_120 = this->map_uint64_uint64_val_;
  local_118 = this->map_sint32_sint32_key_;
  pFStack_110 = this->map_sint32_sint32_val_;
  local_108 = this->map_sint64_sint64_key_;
  pFStack_100 = this->map_sint64_sint64_val_;
  local_f8 = this->map_fixed32_fixed32_key_;
  pFStack_f0 = this->map_fixed32_fixed32_val_;
  local_e8 = this->map_fixed64_fixed64_key_;
  pFStack_e0 = this->map_fixed64_fixed64_val_;
  local_d8 = this->map_sfixed32_sfixed32_key_;
  pFStack_d0 = this->map_sfixed32_sfixed32_val_;
  local_c8 = this->map_sfixed64_sfixed64_key_;
  pFStack_c0 = this->map_sfixed64_sfixed64_val_;
  local_b8 = this->map_int32_float_key_;
  pFStack_b0 = this->map_int32_float_val_;
  local_a8 = this->map_int32_double_key_;
  pFStack_a0 = this->map_int32_double_val_;
  local_98 = this->map_bool_bool_key_;
  pFStack_90 = this->map_bool_bool_val_;
  local_88 = this->map_string_string_key_;
  pFStack_80 = this->map_string_string_val_;
  local_78 = this->map_int32_bytes_key_;
  pFStack_70 = this->map_int32_bytes_val_;
  local_68 = this->map_int32_enum_key_;
  pFStack_60 = this->map_int32_enum_val_;
  local_58 = this->map_int32_foreign_message_key_;
  pFStack_50 = this->map_int32_foreign_message_val_;
  __l._M_len = 0x22;
  __l._M_array = (iterator)local_158;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&local_1b8,__l,(allocator_type *)local_188);
  if (local_1b8._M_dataplus._M_p != (pointer)local_1b8._M_string_length) {
    _Var9._M_p = local_1b8._M_dataplus._M_p;
    do {
      local_198.data_ = *(AssertHelperData **)_Var9._M_p;
      this_01 = (Descriptor *)((local_198.data_)->message)._M_string_length;
      if (this_01 == (Descriptor *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_158,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                   ,0xb4,"fdesc->containing_type() != nullptr");
        v._M_len = (ulong)*(ushort *)(local_198.data_)->file;
        v._M_str = (char *)(~v._M_len + (long)(local_198.data_)->file);
        absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)local_158,v);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_158);
      }
      puVar4 = (ushort *)(local_198.data_)->file;
      pAVar7 = (AssertHelperData *)(ulong)*puVar4;
      if ((pAVar7 == (AssertHelperData *)0x3) && ((char)puVar4[-1] == 'y' && puVar4[-2] == 0x656b))
      {
        local_188 = (undefined1  [8])Descriptor::map_key(this_01);
        testing::internal::
        CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
                  ((internal *)local_158,"fdesc->containing_type()->map_key()","fdesc",
                   (FieldDescriptor **)local_188,(FieldDescriptor **)&local_198);
        if (local_158[0] == (lts_20250127)0x0) {
          testing::Message::Message((Message *)local_188);
          pcVar8 = anon_var_dwarf_a22956 + 5;
          if (_Stack_150._M_head_impl != (LogMessageData *)0x0) {
            pcVar8 = (char *)((_Stack_150._M_head_impl)->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                     ,0xb6,pcVar8);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)local_188);
LAB_00bfad70:
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          if (local_188 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_188 + 8))();
          }
        }
      }
      else {
        local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)puVar4 + ~(ulong)pAVar7);
        local_188 = (undefined1  [8])pAVar7;
        testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[6]>
                  ((internal *)local_158,"fdesc->name()","\"value\"",
                   (basic_string_view<char,_std::char_traits<char>_> *)local_188,
                   (char (*) [6])0x11467c0);
        if (local_158[0] == (lts_20250127)0x0) {
          testing::Message::Message((Message *)local_188);
          pcVar8 = anon_var_dwarf_a22956 + 5;
          if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )_Stack_150._M_head_impl !=
              (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )0x0) {
            pcVar8 = *(char **)_Stack_150._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                     ,0xb8,pcVar8);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          if (local_188 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_188 + 8))();
          }
        }
        if (_Stack_150._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&_Stack_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       _Stack_150._M_head_impl);
        }
        local_188 = (undefined1  [8])
                    Descriptor::map_value
                              ((Descriptor *)((local_198.data_)->message)._M_string_length);
        testing::internal::
        CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
                  ((internal *)local_158,"fdesc->containing_type()->map_value()","fdesc",
                   (FieldDescriptor **)local_188,(FieldDescriptor **)&local_198);
        if (local_158[0] == (lts_20250127)0x0) {
          testing::Message::Message((Message *)local_188);
          pcVar8 = anon_var_dwarf_a22956 + 5;
          if (_Stack_150._M_head_impl != (LogMessageData *)0x0) {
            pcVar8 = (char *)((_Stack_150._M_head_impl)->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                     ,0xb9,pcVar8);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)local_188);
          goto LAB_00bfad70;
        }
      }
      if (_Stack_150._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&_Stack_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Stack_150._M_head_impl);
      }
      _Var9._M_p = _Var9._M_p + 8;
    } while (_Var9._M_p != (pointer)local_1b8._M_string_length);
  }
  local_188 = (undefined1  [8])&DAT_00000030;
  local_158 = (undefined1  [8])&local_148;
  local_158 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_158,(ulong)local_188);
  local_148._M_allocated_capacity = (size_type)local_188;
  *(undefined8 *)((long)local_158 + 0x20) = 0x206e692073656f67;
  *(undefined8 *)((long)local_158 + 0x28) = 0x7061656820656874;
  *(undefined8 *)((long)local_158 + 0x10) = 0x6972747320676e6f;
  *(undefined8 *)((long)local_158 + 0x18) = 0x207461687420676e;
  *(undefined8 *)local_158 = 0x2073692073696854;
  *(undefined8 *)((long)local_158 + 8) = 0x6c20797265762061;
  _Stack_150._M_head_impl = (LogMessageData *)local_188;
  *(char *)((long)local_158 + (long)local_188) = '\0';
  local_40.data_ = (AssertHelperData *)&DAT_0000000f;
  if (local_158 != (undefined1  [8])&local_148) {
    local_40.data_ = (AssertHelperData *)local_188;
  }
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_178[0] = '\0';
  local_38 = 0xf;
  local_188 = (undefined1  [8])local_178;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)&local_198,"long_string().capacity()","std::string().capacity()",
             (unsigned_long *)&local_40,&local_38);
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,CONCAT71(local_178._1_7_,local_178[0]) + 1);
  }
  if (local_158 != (undefined1  [8])&local_148) {
    operator_delete((void *)local_158,(ulong)(local_148._M_allocated_capacity + 1));
  }
  if (local_198.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (local_190 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar8 = (local_190->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0xbe,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_188,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_188);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_158 + 8))();
    }
  }
  if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_190,local_190);
  }
  local_188 = (undefined1  [8])&DAT_00000036;
  local_158 = (undefined1  [8])&local_148;
  local_158 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_158,(ulong)local_188);
  local_148._M_allocated_capacity = (size_type)local_188;
  *(undefined8 *)((long)local_158 + 0x20) = 0x6f67207461687420;
  *(undefined8 *)((long)local_158 + 0x28) = 0x6874206e69207365;
  *(undefined8 *)((long)local_158 + 0x10) = 0x6e6f6c2079726576;
  *(undefined8 *)((long)local_158 + 0x18) = 0x676e697274732067;
  *(undefined8 *)local_158 = 0x2073692073696854;
  *(undefined8 *)((long)local_158 + 8) = 0x20726568746f6e61;
  builtin_strncpy((char *)((long)local_158 + 0x2e),"the heap",8);
  _Stack_150._M_head_impl = (LogMessageData *)local_188;
  *(char *)((long)local_158 + (long)local_188) = '\0';
  local_40.data_ = (AssertHelperData *)&DAT_0000000f;
  if (local_158 != (undefined1  [8])&local_148) {
    local_40.data_ = (AssertHelperData *)local_188;
  }
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_178[0] = '\0';
  local_38 = 0xf;
  local_188 = (undefined1  [8])local_178;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)&local_198,"long_string_2().capacity()","std::string().capacity()",
             (unsigned_long *)&local_40,&local_38);
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,CONCAT71(local_178._1_7_,local_178[0]) + 1);
  }
  if (local_158 != (undefined1  [8])&local_148) {
    operator_delete((void *)local_158,(ulong)(local_148._M_allocated_capacity + 1));
  }
  if (local_198.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (local_190 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar8 = (local_190->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0xbf,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_188,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_188);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_158 + 8))();
    }
  }
  if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_190,local_190);
  }
  if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    local_1b8.field_2._M_allocated_capacity - (long)local_1b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

MapReflectionTester::MapReflectionTester(const Descriptor* base_descriptor)
    : base_descriptor_(base_descriptor) {
  const DescriptorPool* pool = base_descriptor->file()->pool();
  const absl::string_view package = base_descriptor->file()->package();

  map_enum_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".MAP_ENUM_FOO"));
  map_enum_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".MAP_ENUM_BAR"));
  map_enum_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".MAP_ENUM_BAZ"));

  foreign_c_ =
      pool->FindFieldByName(absl::StrCat(package, ".ForeignMessage.c"));
  map_int32_int32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32Int32Entry.key"));
  map_int32_int32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32Int32Entry.value"));
  map_int64_int64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt64Int64Entry.key"));
  map_int64_int64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt64Int64Entry.value"));
  map_uint32_uint32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint32Uint32Entry.key"));
  map_uint32_uint32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint32Uint32Entry.value"));
  map_uint64_uint64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint64Uint64Entry.key"));
  map_uint64_uint64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint64Uint64Entry.value"));
  map_sint32_sint32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint32Sint32Entry.key"));
  map_sint32_sint32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint32Sint32Entry.value"));
  map_sint64_sint64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint64Sint64Entry.key"));
  map_sint64_sint64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint64Sint64Entry.value"));
  map_fixed32_fixed32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed32Fixed32Entry.key"));
  map_fixed32_fixed32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed32Fixed32Entry.value"));
  map_fixed64_fixed64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed64Fixed64Entry.key"));
  map_fixed64_fixed64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed64Fixed64Entry.value"));
  map_sfixed32_sfixed32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed32Sfixed32Entry.key"));
  map_sfixed32_sfixed32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed32Sfixed32Entry.value"));
  map_sfixed64_sfixed64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed64Sfixed64Entry.key"));
  map_sfixed64_sfixed64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed64Sfixed64Entry.value"));
  map_int32_float_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32FloatEntry.key"));
  map_int32_float_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32FloatEntry.value"));
  map_int32_double_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32DoubleEntry.key"));
  map_int32_double_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32DoubleEntry.value"));
  map_bool_bool_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapBoolBoolEntry.key"));
  map_bool_bool_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapBoolBoolEntry.value"));
  map_string_string_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapStringStringEntry.key"));
  map_string_string_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapStringStringEntry.value"));
  map_int32_bytes_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32BytesEntry.key"));
  map_int32_bytes_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32BytesEntry.value"));
  map_int32_enum_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32EnumEntry.key"));
  map_int32_enum_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32EnumEntry.value"));
  map_int32_foreign_message_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32ForeignMessageEntry.key"));
  map_int32_foreign_message_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32ForeignMessageEntry.value"));

  EXPECT_FALSE(map_enum_foo_ == nullptr);
  EXPECT_FALSE(map_enum_bar_ == nullptr);
  EXPECT_FALSE(map_enum_baz_ == nullptr);
  EXPECT_FALSE(map_int32_int32_key_ == nullptr);
  EXPECT_FALSE(map_int32_int32_val_ == nullptr);
  EXPECT_FALSE(map_int64_int64_key_ == nullptr);
  EXPECT_FALSE(map_int64_int64_val_ == nullptr);
  EXPECT_FALSE(map_uint32_uint32_key_ == nullptr);
  EXPECT_FALSE(map_uint32_uint32_val_ == nullptr);
  EXPECT_FALSE(map_uint64_uint64_key_ == nullptr);
  EXPECT_FALSE(map_uint64_uint64_val_ == nullptr);
  EXPECT_FALSE(map_sint32_sint32_key_ == nullptr);
  EXPECT_FALSE(map_sint32_sint32_val_ == nullptr);
  EXPECT_FALSE(map_sint64_sint64_key_ == nullptr);
  EXPECT_FALSE(map_sint64_sint64_val_ == nullptr);
  EXPECT_FALSE(map_fixed32_fixed32_key_ == nullptr);
  EXPECT_FALSE(map_fixed32_fixed32_val_ == nullptr);
  EXPECT_FALSE(map_fixed64_fixed64_key_ == nullptr);
  EXPECT_FALSE(map_fixed64_fixed64_val_ == nullptr);
  EXPECT_FALSE(map_sfixed32_sfixed32_key_ == nullptr);
  EXPECT_FALSE(map_sfixed32_sfixed32_val_ == nullptr);
  EXPECT_FALSE(map_sfixed64_sfixed64_key_ == nullptr);
  EXPECT_FALSE(map_sfixed64_sfixed64_val_ == nullptr);
  EXPECT_FALSE(map_int32_float_key_ == nullptr);
  EXPECT_FALSE(map_int32_float_val_ == nullptr);
  EXPECT_FALSE(map_int32_double_key_ == nullptr);
  EXPECT_FALSE(map_int32_double_val_ == nullptr);
  EXPECT_FALSE(map_bool_bool_key_ == nullptr);
  EXPECT_FALSE(map_bool_bool_val_ == nullptr);
  EXPECT_FALSE(map_string_string_key_ == nullptr);
  EXPECT_FALSE(map_string_string_val_ == nullptr);
  EXPECT_FALSE(map_int32_bytes_key_ == nullptr);
  EXPECT_FALSE(map_int32_bytes_val_ == nullptr);
  EXPECT_FALSE(map_int32_enum_key_ == nullptr);
  EXPECT_FALSE(map_int32_enum_val_ == nullptr);
  EXPECT_FALSE(map_int32_foreign_message_key_ == nullptr);
  EXPECT_FALSE(map_int32_foreign_message_val_ == nullptr);

  std::vector<const FieldDescriptor*> all_map_descriptors = {
      map_int32_int32_key_,
      map_int32_int32_val_,
      map_int64_int64_key_,
      map_int64_int64_val_,
      map_uint32_uint32_key_,
      map_uint32_uint32_val_,
      map_uint64_uint64_key_,
      map_uint64_uint64_val_,
      map_sint32_sint32_key_,
      map_sint32_sint32_val_,
      map_sint64_sint64_key_,
      map_sint64_sint64_val_,
      map_fixed32_fixed32_key_,
      map_fixed32_fixed32_val_,
      map_fixed64_fixed64_key_,
      map_fixed64_fixed64_val_,
      map_sfixed32_sfixed32_key_,
      map_sfixed32_sfixed32_val_,
      map_sfixed64_sfixed64_key_,
      map_sfixed64_sfixed64_val_,
      map_int32_float_key_,
      map_int32_float_val_,
      map_int32_double_key_,
      map_int32_double_val_,
      map_bool_bool_key_,
      map_bool_bool_val_,
      map_string_string_key_,
      map_string_string_val_,
      map_int32_bytes_key_,
      map_int32_bytes_val_,
      map_int32_enum_key_,
      map_int32_enum_val_,
      map_int32_foreign_message_key_,
      map_int32_foreign_message_val_};
  for (const FieldDescriptor* fdesc : all_map_descriptors) {
    ABSL_CHECK(fdesc->containing_type() != nullptr) << fdesc->name();
    if (fdesc->name() == "key") {
      EXPECT_EQ(fdesc->containing_type()->map_key(), fdesc);
    } else {
      EXPECT_EQ(fdesc->name(), "value");
      EXPECT_EQ(fdesc->containing_type()->map_value(), fdesc);
    }
  }

  // Must be heap allocated.
  EXPECT_NE(long_string().capacity(), std::string().capacity());
  EXPECT_NE(long_string_2().capacity(), std::string().capacity());
}